

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfer.cc
# Opt level: O2

Node __thiscall verona::Infer::do_block(Infer *this,Node *block)

{
  TokenDef *pTVar1;
  NodeDef *this_00;
  element_type *peVar2;
  bool bVar3;
  int __flags;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  void *__child_stack;
  void *__child_stack_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_02;
  anon_class_8_1_8991fb9c in_R8;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  Node NVar4;
  WFLookup sel;
  Lookup l;
  Btype type;
  WFLookup rhs;
  Node ret;
  WFLookup args;
  Node params;
  shared_ptr<trieste::NodeDef> stmt;
  WFLookup local_388;
  Token local_368;
  undefined1 local_360 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  __shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2> local_308;
  WFLookup local_2f8;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_2d8;
  WFLookup local_2c8;
  Infer *local_2a8;
  element_type *local_2a0;
  __shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2> *local_298;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_290;
  Nodes local_288;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_270;
  __shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2> *local_260;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *local_258;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *local_250;
  Token local_248;
  undefined1 local_240 [16];
  Node local_230;
  verona local_220 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_218;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_210;
  __shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2> local_200;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_1f0;
  verona local_1e0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d8;
  __shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2> local_1d0;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_1c0;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_1b0;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_1a0;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_190;
  __shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2> local_180;
  undefined1 local_170 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_148;
  __shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2> local_140;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_130;
  verona local_120 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_118;
  __shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2> local_110;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_100;
  verona local_f0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_e0;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_d0;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_c0;
  trieste local_b0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  __shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  local_250 = (__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
              (in_RDX._M_pi)->_vptr__Sp_counted_base[0xb];
  local_258 = (__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
              (in_RDX._M_pi)->_vptr__Sp_counted_base[0xc];
  local_260 = (__shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2> *)(block + 2);
  local_298 = (__shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2> *)(block + 3);
  local_2a0 = (element_type *)this;
  local_290 = in_RDX._M_pi;
  do {
    if (local_250 == local_258) {
      (local_2a0->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
      super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      (local_2a0->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
      super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_001c723b:
      NVar4.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           in_RDX._M_pi;
      NVar4.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_2a0;
      return (Node)NVar4.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
    }
    ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_270,local_250);
    pTVar1 = ((local_270._M_ptr)->type_).def;
    if (pTVar1 == (TokenDef *)Bind) {
      local_360._0_8_ = Rhs;
      trieste::operator/(&local_2f8,(Node *)&local_270,(Token *)local_360);
      local_388.wf = (Wellformed *)Type;
      trieste::operator/((WFLookup *)local_360,(Node *)&local_270,(Token *)&local_388);
      ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,
                 (__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)(local_360 + 8));
      make_btype((verona *)&local_308,(Node *)&local_40);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_350);
      pTVar1 = ((local_2f8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->type_).def;
      if (pTVar1 == (TokenDef *)TypeTest) {
        std::__shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_50,local_298);
        std::__shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_60,&local_308);
        check((Infer *)block,(Btype *)&local_50,(Btype *)&local_60);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_60._M_refcount);
        this_01 = &local_50._M_refcount;
LAB_001c6a79:
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_01);
      }
      else {
        if (pTVar1 == (TokenDef *)Cast) {
          local_388.wf = (Wellformed *)Type;
          trieste::wf::detail::WFLookup::operator/
                    ((WFLookup *)local_360,&local_2f8,(Token *)&local_388);
          ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_70,
                     (__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)(local_360 + 8));
          std::__shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_80,&local_308);
          check((Infer *)block,(Node *)&local_70,(Btype *)&local_80);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_80._M_refcount);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
          this_01 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_350;
          goto LAB_001c6a79;
        }
        local_388.wf = (Wellformed *)Move;
        local_388.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)Copy;
        local_360._8_8_ = (element_type *)0x2;
        local_360._0_8_ = &local_388;
        bVar3 = trieste::Token::in(&(local_2f8.node.
                                     super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->type_,(initializer_list<trieste::Token> *)local_360);
        if (bVar3) {
          ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_90,
                     &local_2f8.node.
                      super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>);
          gamma(local_220,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
          std::__shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_a0,&local_308);
          check((Infer *)block,(Node *)local_220,(Btype *)&local_a0);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a0._M_refcount);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_218);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
        }
        else {
          pTVar1 = ((local_2f8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->type_).def;
          if (pTVar1 == (TokenDef *)FieldRef) {
            trieste::TokenDef::operator_cast_to_shared_ptr((TokenDef *)local_240);
            local_2d8._M_ptr = (element_type *)Ref;
            local_2a8 = (Infer *)block;
            trieste::wf::detail::WFLookup::operator/
                      ((WFLookup *)local_360,&local_2f8,(Token *)&local_2d8);
            ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_e0,
                       (__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)(local_360 + 8)
                      );
            gamma((verona *)&local_d0,(double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
            ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_c0,&local_d0);
            trieste::operator<<((trieste *)&local_230,(Node *)local_240,(EphemeralNode *)&local_c0);
            this_00 = (local_2a8->cls).
                      super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_368.def = (TokenDef *)Ident;
            trieste::wf::detail::WFLookup::operator/(&local_2c8,&local_2f8,&local_368);
            trieste::NodeDef::lookdown
                      (&local_288,this_00,
                       &(local_2c8.node.
                         super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        location_);
            local_248.def = (TokenDef *)Type;
            trieste::operator/(&local_388,
                               local_288.
                               super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,&local_248);
            ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_100,
                       &local_388.node.
                        super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>);
            reftype(local_f0,(Node *)&local_100);
            trieste::operator<<(local_b0,&local_230,(Node *)local_f0);
            block = (Node *)local_2a8;
            std::__shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_110,&local_308);
            check((Infer *)block,(Node *)local_b0,(Btype *)&local_110);
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_110._M_refcount);
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8);
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8);
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_100._M_refcount);
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_388.node.
                        super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                      );
            ::std::
            vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
            ::~vector((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                       *)&local_288);
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_2c8.node.
                        super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                      );
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_230.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_c0._M_refcount);
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_d0._M_refcount);
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_e0._M_refcount);
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_350);
            this_02 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_240 + 8);
LAB_001c71c2:
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_02);
          }
          else if (pTVar1 == (TokenDef *)Conditional) {
            local_388.wf = (Wellformed *)If;
            trieste::wf::detail::WFLookup::operator/
                      ((WFLookup *)local_360,&local_2f8,(Token *)&local_388);
            ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_130,
                       (__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)(local_360 + 8)
                      );
            gamma(local_120,(double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
            std::__shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_140,local_298);
            check((Infer *)block,(Node *)local_120,(Btype *)&local_140);
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_140._M_refcount);
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_118);
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_130._M_refcount);
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_350);
            local_388.wf = (Wellformed *)True;
            trieste::wf::detail::WFLookup::operator/
                      ((WFLookup *)local_360,&local_2f8,(Token *)&local_388);
            do_block((Infer *)(local_170 + 0x20),block);
            std::__shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2> *)
                       (local_170 + 0x10),&local_308);
            check((Infer *)block,(Node *)(local_170 + 0x20),(Btype *)(local_170 + 0x10));
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_170 + 0x18));
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_148);
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_350);
            local_388.wf = (Wellformed *)False;
            trieste::wf::detail::WFLookup::operator/
                      ((WFLookup *)local_360,&local_2f8,(Token *)&local_388);
            do_block((Infer *)local_170,block);
            std::__shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_180,&local_308);
            check((Infer *)block,(Node *)local_170,(Btype *)&local_180);
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_180._M_refcount);
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_170 + 8));
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_350);
          }
          else {
            if (pTVar1 == (TokenDef *)Call) {
              local_360._0_8_ = Selector;
              trieste::wf::detail::WFLookup::operator/(&local_388,&local_2f8,(Token *)local_360);
              __flags = 0x277168;
              if (((local_388.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->type_).def == (TokenDef *)FQFunction) {
                ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                          (&local_190,
                           &local_388.node.
                            super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>);
                resolve_fq((Lookup *)local_360,(Node *)&local_190);
                ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&local_190._M_refcount);
                local_2d8._M_ptr = (element_type *)Params;
                trieste::operator/(&local_2c8,(Node *)local_360,(Token *)&local_2d8);
                ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                          (&local_1a0,
                           &local_2c8.node.
                            super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>);
                trieste::clone((trieste *)&local_288,(__fn *)&local_1a0,__child_stack,__flags,
                               in_R8.this);
                ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&local_1a0._M_refcount);
                ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&local_2c8.node.
                            super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                local_368.def = (TokenDef *)Type;
                trieste::operator/(&local_2c8,(Node *)local_360,&local_368);
                ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                          (&local_1b0,
                           &local_2c8.node.
                            super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>);
                trieste::clone((trieste *)&local_2d8,(__fn *)&local_1b0,__child_stack_00,__flags,
                               in_R8.this);
                ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&local_1b0._M_refcount);
                ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&local_2c8.node.
                            super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                local_368.def = (TokenDef *)Args;
                trieste::wf::detail::WFLookup::operator/(&local_2c8,&local_2f8,&local_368);
                Lookup::sub((Lookup *)local_360,(Node *)&local_288);
                Lookup::sub((Lookup *)local_360,(Node *)&local_2d8);
                in_R8.this = (Infer *)block;
                ::std::
                __equal4<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>,verona::Infer::do_block(std::shared_ptr<trieste::NodeDef>&)::_lambda(std::shared_ptr<trieste::NodeDef>&,std::shared_ptr<trieste::NodeDef>&)_1_>
                          ((shared_ptr<trieste::NodeDef> *)
                           local_288.
                           super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[5].
                           super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi,
                           (shared_ptr<trieste::NodeDef> *)
                           local_288.
                           super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[6].
                           super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           ((local_2c8.node.
                             super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            )->children).
                           super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           ((local_2c8.node.
                             super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            )->children).
                           super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(anon_class_8_1_8991fb9c)block
                          );
                ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                          (&local_1c0,&local_2d8);
                std::__shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                          (&local_1d0,&local_308);
                check((Infer *)block,(Node *)&local_1c0,(Btype *)&local_1d0);
                ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1d0._M_refcount);
                ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&local_1c0._M_refcount);
                ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&local_2c8.node.
                            super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&local_2d8._M_refcount);
                ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                           &local_288.
                            super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
                Lookup::~Lookup((Lookup *)local_360);
              }
              this_02 = &local_388.node.
                         super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount;
              goto LAB_001c71c2;
            }
            local_360._0_8_ = Int;
            local_360._8_8_ = Bin;
            local_350._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Oct;
            local_348 = Hex;
            local_340 = Float;
            local_338 = HexFloat;
            local_330 = Char;
            local_328 = Escaped;
            local_320 = String;
            local_318 = Tuple;
            local_310 = LLVM;
            local_388.wf = (Wellformed *)local_360;
            local_388.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0xb;
            bVar3 = trieste::Token::in(&(local_2f8.node.
                                         super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->type_,
                                       (initializer_list<trieste::Token> *)&local_388);
            if (!bVar3) {
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/passes/typeinfer.cc"
                            ,0x84,"Node verona::Infer::do_block(Node &)");
            }
          }
        }
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_308._M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_2f8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    else if (pTVar1 == (TokenDef *)Return) {
      if (local_270._M_ptr != *(element_type **)(local_290->_vptr__Sp_counted_base[0xc] + -0x10)) {
        __assert_fail("stmt == block->back()",
                      "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/passes/typeinfer.cc"
                      ,0x89,"Node verona::Infer::do_block(Node &)");
      }
      local_2f8.wf = (Wellformed *)Ref;
      trieste::operator/((WFLookup *)local_360,(Node *)&local_270,(Token *)&local_2f8);
      ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_1f0,
                 (__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)(local_360 + 8));
      gamma(local_1e0,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      std::__shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_200,local_260);
      check((Infer *)block,(Node *)local_1e0,(Btype *)&local_200);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_200._M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1d8);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1f0._M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_350);
    }
    else {
      if (pTVar1 == (TokenDef *)Move) {
        if (local_270._M_ptr != *(element_type **)(local_290->_vptr__Sp_counted_base[0xc] + -0x10))
        {
          __assert_fail("stmt == block->back()",
                        "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/passes/typeinfer.cc"
                        ,0x8e,"Node verona::Infer::do_block(Node &)");
        }
        ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_210,&local_270);
        peVar2 = local_2a0;
        gamma((verona *)local_2a0,(double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_210._M_refcount);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_270._M_refcount);
        in_RDX._M_pi = extraout_RDX_00;
        local_2a0 = peVar2;
        goto LAB_001c723b;
      }
      local_360._0_8_ = Class;
      local_360._8_8_ = TypeAlias;
      local_350._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LLVM;
      local_348 = Drop;
      local_2f8.wf = (Wellformed *)local_360;
      local_2f8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x4;
      bVar3 = trieste::Token::in(&(local_270._M_ptr)->type_,
                                 (initializer_list<trieste::Token> *)&local_2f8);
      if (!bVar3) {
        __assert_fail("stmt->in({Class, TypeAlias, LLVM, Drop})",
                      "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/passes/typeinfer.cc"
                      ,0x93,"Node verona::Infer::do_block(Node &)");
      }
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_270._M_refcount);
    local_250 = local_250 + 1;
    in_RDX._M_pi = extraout_RDX;
  } while( true );
}

Assistant:

Node do_block(Node& block)
    {
      for (auto stmt : *block)
      {
        if (stmt == Bind)
        {
          // TODO: literals
          auto rhs = stmt / Rhs;
          auto type = make_btype(stmt / Type);

          if (rhs == TypeTest)
            check(bool_type, type);
          else if (rhs == Cast)
            check(rhs / Type, type);
          else if (rhs->in({Move, Copy}))
            check(gamma(rhs), type);
          else if (rhs == FieldRef)
          {
            // TODO: Self substitution?
            // this is failing when `type` is a TypeVar, unclear why
            check(
              TypeView << -gamma(rhs / Ref)
                       << reftype(
                            cls->lookdown((rhs / Ident)->location()).front() /
                            Type),
              type);
          }
          else if (rhs == Conditional)
          {
            check(gamma(rhs / If), bool_type);
            check(do_block(rhs / True), type);
            check(do_block(rhs / False), type);
          }
          else if (rhs == Call)
          {
            auto sel = rhs / Selector;

            if (sel == FQFunction)
            {
              // TODO: may not have a function of this arity
              auto l = resolve_fq(sel);
              auto params = clone(l.def / Params);
              auto ret = clone(l.def / Type);
              auto args = rhs / Args;
              l.sub(params);
              l.sub(ret);

              (void)std::equal(
                params->begin(),
                params->end(),
                args->begin(),
                args->end(),
                [&](Node& param, Node& arg) {
                  check(gamma(arg), make_btype(param / Type));
                  return true;
                });

              check(ret, type);
            }
            else
            {
              // TODO: selector
            }
          }
          else if (rhs->in(
                     {Int,
                      Bin,
                      Oct,
                      Hex,
                      Float,
                      HexFloat,
                      Char,
                      Escaped,
                      String,
                      Tuple,
                      LLVM}))
          {
            // TODO:
          }
          else
          {
            assert(false);
          }
        }
        else if (stmt == Return)
        {
          assert(stmt == block->back());
          check(gamma(stmt / Ref), ret_type);
        }
        else if (stmt == Move)
        {
          assert(stmt == block->back());
          return gamma(stmt);
        }
        else
        {
          assert(stmt->in({Class, TypeAlias, LLVM, Drop}));
        }
      }

      return {};
    }